

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_usdf.cpp
# Opt level: O3

bool P_ParseUSDF(int lumpnum,FileReader *lump,int lumplen)

{
  bool bVar1;
  USDFParser parse;
  USDFParser UStack_138;
  
  FScanner::FScanner((FScanner *)&UStack_138);
  UStack_138.super_UDMFParserBase.namespc.Index = 0;
  UStack_138.super_UDMFParserBase.parsedString.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  bVar1 = USDFParser::Parse(&UStack_138,lumpnum,lump,lumplen);
  FString::~FString(&UStack_138.super_UDMFParserBase.parsedString);
  FScanner::~FScanner((FScanner *)&UStack_138);
  return bVar1;
}

Assistant:

bool P_ParseUSDF(int lumpnum, FileReader *lump, int lumplen)
{
	USDFParser parse;

	try
	{
		if (!parse.Parse(lumpnum, lump, lumplen))
		{
			// clean up the incomplete dialogue structures here
			return false;
		}
		return true;
	}
	catch(CRecoverableError &err)
	{
		Printf("%s", err.GetMessage());
		return false;
	}
}